

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.h
# Opt level: O0

void __thiscall Clasp::DefaultUnfoundedCheck::AddSource::operator()(AddSource *this,NodeId bId)

{
  bool bVar1;
  uint32 uVar2;
  reference pBVar3;
  size_type in_ESI;
  DefaultUnfoundedCheck *in_RDI;
  BodyPtr BVar4;
  BodyPtr n;
  NodeId in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  DefaultUnfoundedCheck *this_00;
  
  BVar4 = getBody(in_RDI,in_stack_ffffffffffffffbc);
  this_00 = (DefaultUnfoundedCheck *)BVar4.node;
  pBVar3 = bk_lib::
           pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
           ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
                         *)((in_RDI->super_PostPropagator).super_Constraint._vptr_Constraint + 7),
                        in_ESI);
  uVar2 = pBVar3->lower_or_ext - 1;
  pBVar3->lower_or_ext = uVar2;
  if (uVar2 == 0) {
    uVar2 = (((Node *)&((DefaultUnfoundedCheck *)BVar4.node)->super_PostPropagator)->lit).rep_;
    bVar1 = Solver::isFalse((Solver *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                            (Literal)(uint32)((ulong)this_00 >> 0x20));
    if (!bVar1) {
      forwardSource(this_00,(BodyPtr *)CONCAT44(uVar2,in_stack_ffffffffffffffc8));
    }
  }
  return;
}

Assistant:

void operator()(NodeId bId) const {
			BodyPtr n(self->getBody(bId));
			if (--self->bodies_[bId].lower_or_ext == 0 && !self->solver_->isFalse(n.node->lit)) { self->forwardSource(n); }
		}